

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O0

void testRoundingError(void)

{
  int in_stack_00000024;
  
  anon_unknown.dwarf_bd0dc::testNormalizedRounding(in_stack_00000024);
  anon_unknown.dwarf_bd0dc::testDenormalizedRounding(in_stack_00000024);
  anon_unknown.dwarf_bd0dc::testNormalizedRounding(in_stack_00000024);
  anon_unknown.dwarf_bd0dc::testDenormalizedRounding(in_stack_00000024);
  anon_unknown.dwarf_bd0dc::testNormalizedRounding(in_stack_00000024);
  anon_unknown.dwarf_bd0dc::testDenormalizedRounding(in_stack_00000024);
  anon_unknown.dwarf_bd0dc::testNormalizedRounding(in_stack_00000024);
  anon_unknown.dwarf_bd0dc::testDenormalizedRounding(in_stack_00000024);
  return;
}

Assistant:

void
testRoundingError ()
{
    testNormalizedRounding (10);
    testDenormalizedRounding (10);
    testNormalizedRounding (9);
    testDenormalizedRounding (9);
    testNormalizedRounding (1);
    testDenormalizedRounding (1);
    testNormalizedRounding (0);
    testDenormalizedRounding (0);
}